

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,uchar *memory,char **err)

{
  byte bVar1;
  pointer paVar2;
  int iVar3;
  char *pcVar4;
  uchar *puVar5;
  reference __src;
  byte *pbVar6;
  float *pfVar7;
  char **ppcVar8;
  int *piVar9;
  int *piVar10;
  uchar *puVar11;
  pointer paVar12;
  int c;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int local_12c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  ulong local_d8;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  string attrType;
  string attrName;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> customAttribs;
  EXRAttribute attrib;
  
  if (exrImage == (EXRImage *)0x0 || memory == (uchar *)0x0) {
    iVar13 = -1;
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar4 = "Invalid argument.";
  }
  else if (*(int *)memory == 0x1312f76) {
    if ((((memory[4] == '\x02') && (memory[5] == '\0')) && (memory[6] == '\0')) &&
       (memory[7] == '\0')) {
      puVar11 = memory + 8;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      channels.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      customAttribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      customAttribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      customAttribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar13 = -3;
      local_f4 = 0.0;
      local_f0 = 0.0;
      local_f8 = 1.0;
      local_ec = 1.0;
      local_108 = -1;
      bVar1 = 0;
      local_d8 = 0xffffffffffffffff;
      local_104 = local_108;
      local_100 = local_108;
      local_fc = local_108;
      local_e8 = local_108;
      local_e4 = local_108;
      local_e0 = local_108;
      local_dc = local_108;
      do {
        attrName._M_dataplus._M_p = (pointer)&attrName.field_2;
        attrName._M_string_length = 0;
        attrName.field_2._M_local_buf[0] = '\0';
        attrType._M_dataplus._M_p = (pointer)&attrType.field_2;
        attrType._M_string_length = 0;
        attrType.field_2._M_local_buf[0] = '\0';
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        puVar5 = (uchar *)anon_unknown.dwarf_ec2bc::ReadAttribute
                                    (&attrName,&attrType,&data,(char *)puVar11);
        if (puVar5 == (uchar *)0x0) {
          puVar11 = puVar11 + 1;
          local_12c = 2;
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&attrName);
          if (iVar3 == 0) {
            if (4 < *data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) {
              if (err != (char **)0x0) {
                *err = "Unsupported compression type.";
              }
              iVar13 = -5;
LAB_0013e14d:
              local_12c = 1;
              goto LAB_0013e272;
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&attrName);
            if (iVar3 == 0) {
              anon_unknown.dwarf_ec2bc::ReadChannelInfo(&channels,&data);
              local_d8 = ((long)channels.
                                super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)channels.
                               super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30;
              if ((int)local_d8 < 1) {
                if (err != (char **)0x0) {
                  *err = "Invalid channels format.";
                }
                iVar13 = -6;
                goto LAB_0013e14d;
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)&attrName);
              if (iVar3 == 0) {
                piVar10 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,0);
                local_fc = *piVar10;
                piVar10 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,4);
                local_100 = *piVar10;
                piVar10 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,8);
                local_104 = *piVar10;
                piVar10 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,0xc);
                local_108 = *piVar10;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)&attrName);
                if (iVar3 == 0) {
                  piVar10 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             (&data,0);
                  local_dc = *piVar10;
                  piVar10 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             (&data,4);
                  local_e0 = *piVar10;
                  piVar10 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             (&data,8);
                  local_e4 = *piVar10;
                  piVar10 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             (&data,0xc);
                  local_e8 = *piVar10;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)&attrName);
                  if (iVar3 == 0) {
                    pbVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0)
                    ;
                    bVar1 = *pbVar6;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)&attrName);
                    if (iVar3 == 0) {
                      pfVar7 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                        at(&data,0);
                      local_ec = *pfVar7;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)&attrName);
                      if (iVar3 == 0) {
                        pfVar7 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::at(&data,0);
                        local_f0 = *pfVar7;
                        pfVar7 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::at(&data,4);
                        local_f4 = *pfVar7;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)&attrName);
                        if (iVar3 == 0) {
                          pfVar7 = (float *)std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            at(&data,0);
                          local_f8 = *pfVar7;
                        }
                        else {
                          attrib.name = strdup(attrName._M_dataplus._M_p);
                          attrib.type = strdup(attrType._M_dataplus._M_p);
                          attrib.size = (int)((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          puVar11 = (uchar *)malloc((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          attrib.value = puVar11;
                          __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            (&data,0);
                          memcpy(puVar11,__src,
                                 (long)data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)data.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                          std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                    (&customAttribs,&attrib);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          local_12c = 0;
          puVar11 = puVar5;
        }
LAB_0013e272:
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        std::__cxx11::string::~string((string *)&attrType);
        std::__cxx11::string::~string((string *)&attrName);
        if (local_12c != 0) {
          if (local_12c == 2) {
            if (local_fc < 0) {
              __assert_fail("dx >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                            ,0x2b0c,
                            "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                           );
            }
            if (local_100 < 0) {
              __assert_fail("dy >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                            ,0x2b0d,
                            "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                           );
            }
            if (local_104 < 0) {
              __assert_fail("dw >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                            ,0x2b0e,
                            "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                           );
            }
            if (local_108 < 0) {
              __assert_fail("dh >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                            ,0x2b0f,
                            "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                           );
            }
            if ((int)local_d8 < 1) {
              __assert_fail("numChannels >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                            ,0x2b10,
                            "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                           );
            }
            uVar15 = local_d8 & 0xffffffff;
            ppcVar8 = (char **)malloc(uVar15 * 8);
            paVar2 = channels.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            exrImage->channel_names = ppcVar8;
            paVar12 = channels.
                      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
              pcVar4 = strdup((paVar12->name)._M_dataplus._M_p);
              exrImage->channel_names[uVar14] = pcVar4;
              paVar12 = paVar12 + 1;
            }
            exrImage->num_channels = (int)local_d8;
            exrImage->width = (local_104 - local_fc) + 1;
            exrImage->height = (local_108 - local_100) + 1;
            exrImage->pixel_aspect_ratio = local_ec;
            exrImage->screen_window_center[0] = local_f0;
            exrImage->screen_window_center[1] = local_f4;
            exrImage->screen_window_width = local_f8;
            exrImage->display_window[0] = local_dc;
            exrImage->display_window[1] = local_e0;
            exrImage->display_window[2] = local_e4;
            exrImage->display_window[3] = local_e8;
            exrImage->data_window[0] = local_fc;
            exrImage->data_window[1] = local_100;
            exrImage->data_window[2] = local_104;
            exrImage->data_window[3] = local_108;
            exrImage->line_order = (uint)bVar1;
            piVar9 = (int *)malloc(uVar15 * 4);
            exrImage->pixel_types = piVar9;
            piVar10 = &paVar2->pixelType;
            for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
              piVar9[uVar14] = *piVar10;
              piVar10 = piVar10 + 0xc;
            }
            piVar10 = (int *)malloc(uVar15 * 4);
            exrImage->requested_pixel_types = piVar10;
            piVar9 = &paVar2->pixelType;
            iVar13 = 0;
            for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
              piVar10[uVar14] = *piVar9;
              piVar9 = piVar9 + 0xc;
            }
          }
          std::_Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>::~_Vector_base
                    (&customAttribs.
                      super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>);
          std::
          vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
          ::~vector(&channels);
          return iVar13;
        }
      } while( true );
    }
    iVar13 = -4;
    if (err == (char **)0x0) {
      return -4;
    }
    pcVar4 = "Unsupported version or scanline.";
  }
  else {
    iVar13 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar4 = "Header mismatch.";
  }
  *err = pcVar4;
  return iVar13;
}

Assistant:

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,
                                         const unsigned char *memory,
                                         const char **err) {
  if (exrImage == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numChannels = -1;
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme.
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  float pixelAspectRatio = 1.0f;
  unsigned char lineOrder = 0; // 0 -> increasing y; 1 -> decreasing
  std::vector<ChannelInfo> channels;

  int numCustomAttributes = 0;
  std::vector<EXRAttribute> customAttribs;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs, 3: ZIP or 4: PIZ
      if (data[0] > 4) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(lineOrder));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes < TINYEXR_MAX_ATTRIBUTES) {
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        customAttribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  {
    exrImage->channel_names =
        (const char **)malloc(sizeof(const char *) * numChannels);
    for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
      exrImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
      exrImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
    }
    exrImage->num_channels = numChannels;

    exrImage->width = dataWidth;
    exrImage->height = dataHeight;
    exrImage->pixel_aspect_ratio = pixelAspectRatio;
    exrImage->screen_window_center[0] = screenWindowCenter[0];
    exrImage->screen_window_center[1] = screenWindowCenter[1];
    exrImage->screen_window_width = screenWindowWidth;
    exrImage->display_window[0] = displayWindow[0];
    exrImage->display_window[1] = displayWindow[1];
    exrImage->display_window[2] = displayWindow[2];
    exrImage->display_window[3] = displayWindow[3];
    exrImage->data_window[0] = dx;
    exrImage->data_window[1] = dy;
    exrImage->data_window[2] = dw;
    exrImage->data_window[3] = dh;
    exrImage->line_order = lineOrder;

    exrImage->pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->pixel_types[c] = channels[c].pixelType;
    }

    // Initially fill with values of `pixel-types`
    exrImage->requested_pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->requested_pixel_types[c] = channels[c].pixelType;
    }
  }

  if (numCustomAttributes > 0) {
    assert(customAttribs.size() < TINYEXR_MAX_ATTRIBUTES);
    exrImage->num_custom_attributes = numCustomAttributes;

    for (int i = 0; i < (int)customAttribs.size(); i++) {
      exrImage->custom_attributes[i] = customAttribs[i];
    }
  } 

  return 0; // OK
}